

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O2

void __thiscall Metrics::Report(Metrics *this)

{
  undefined8 *puVar1;
  long *plVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (plVar2 = *(long **)this; plVar2 != *(long **)&this->field_0x8; plVar2 = plVar2 + 1) {
    if ((int)uVar3 <= (int)*(uint *)(*plVar2 + 8)) {
      uVar3 = *(uint *)(*plVar2 + 8);
    }
  }
  printf("%-*s\t%-6s\t%-9s\t%s\n",(ulong)uVar3,"metric","count","avg (us)","total (ms)");
  for (plVar2 = *(long **)this; plVar2 != *(long **)&this->field_0x8; plVar2 = plVar2 + 1) {
    puVar1 = (undefined8 *)*plVar2;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n",(double)(long)puVar1[5] / (double)*(int *)(puVar1 + 4),
           (double)(long)puVar1[5] / 1000.0,(ulong)uVar3,*puVar1);
  }
  return;
}

Assistant:

void Metrics::Report() {
  int width = 0;
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    width = max((int)(*i)->name.size(), width);
  }

  printf("%-*s\t%-6s\t%-9s\t%s\n", width,
         "metric", "count", "avg (us)", "total (ms)");
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    Metric* metric = *i;
    double total = metric->sum / (double)1000;
    double avg = metric->sum / (double)metric->count;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n", width, metric->name.c_str(),
           metric->count, avg, total);
  }
}